

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

void __thiscall Polymer::Move(Polymer *this,int pol_index)

{
  string *psVar1;
  MobileElementManager *this_00;
  element_type *peVar2;
  pointer pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  SpeciesTracker *pSVar7;
  element_type *peVar8;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  pointer pIVar9;
  Ptr pol;
  Ptr transcript;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  intervalVector local_78;
  pointer local_58;
  Ptr local_50;
  Ptr local_40;
  
  this_00 = &this->polymerases_;
  MobileElementManager::GetPol((MobileElementManager *)&local_88,(int)this_00);
  peVar2 = local_88;
  local_58 = (pointer)(long)local_88->start_;
  iVar6 = local_88->stop_;
  (*local_88->_vptr_MobileElement[2])(local_88);
  bVar4 = CheckPolCollisions(this,pol_index);
  if (bVar4) {
    (*peVar2->_vptr_MobileElement[3])(peVar2);
  }
  else {
    if (peVar2->polymerasereadthrough_ == true) {
      local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_80;
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_80->_M_use_count = local_80->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_80->_M_use_count = local_80->_M_use_count + 1;
        }
      }
      bVar4 = CheckReadthroughPolCollisions(this,&local_40);
      if (local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (bVar4) {
        (*local_88->_vptr_MobileElement[3])(local_88);
        goto LAB_00117f28;
      }
    }
    local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_80;
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_80->_M_use_count = local_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_80->_M_use_count = local_80->_M_use_count + 1;
      }
    }
    bVar4 = CheckMaskCollisions(this,&local_50);
    if (local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (bVar4) {
      (*local_88->_vptr_MobileElement[3])(local_88);
    }
    else {
      psVar1 = &local_88->name_;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        pSVar7 = SpeciesTracker::Instance();
        if ((pSVar7->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          MobileElementManager::DecrementtRNA(this_00,iVar6);
        }
      }
      CheckBehind(this,(int)local_58,local_88->start_);
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        CheckAheadRnase(this,iVar6,local_88->stop_);
      }
      else {
        CheckAhead(this,iVar6,local_88->stop_);
      }
      bVar4 = CheckTermination(this,pol_index);
      if (bVar4) {
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar6 != 0) {
          local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
                    (&this->binding_sites_,(unsigned_long)local_58,(long)local_88->stop_,&local_78);
          pIVar3 = local_78.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar9 = local_78.
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar3;
              pIVar9 = pIVar9 + 1) {
            peVar8 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar6 = (peVar8->super_FixedElement).covered_;
            if (0 < iVar6) {
              iVar6 = iVar6 + -1;
              (peVar8->super_FixedElement).covered_ = iVar6;
            }
            if (iVar6 == 0 && 0 < (peVar8->super_FixedElement).old_covered_) {
              LogUncover(this,&(peVar8->super_FixedElement).name_);
              peVar8 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar6 = (peVar8->super_FixedElement).covered_;
            }
            (peVar8->super_FixedElement).old_covered_ = iVar6;
          }
          std::
          vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::~vector(&local_78);
          goto LAB_00117f28;
        }
      }
      MobileElementManager::GetAttached((MobileElementManager *)&local_78,(int)this_00);
      if (local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*((_func_int **)
          (local_78.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->start)[2])();
      }
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar6 == 0) {
        MobileElementManager::UpdatePropensity(this_00,pol_index);
      }
      if (local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
LAB_00117f28:
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  return;
}

Assistant:

void Polymer::Move(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index); 

  // Record old positions
  int old_start = pol->start();
  int old_stop = pol->stop();

  // Move polymerase
  pol->Move();

  // Check for upstream polymerase collision
  bool pol_collision = CheckPolCollisions(pol_index);
  if (pol_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Check for collisions with polymerases at the start of the genome,
  // if simulating readthrough on a circular plasmid
  if (pol->polymerasereadthrough()) {
    bool readthrough_collision = CheckReadthroughPolCollisions(pol);
    if (readthrough_collision) {
      pol->MoveBack();
      return;
    }
  }

  // Check for collisions with mask
  bool mask_collision = CheckMaskCollisions(pol);
  if (mask_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Choose a tRNA to consume, if pol is a ribosome AND 
  // the simulation is using tRNAs
  if (pol->name() == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    polymerases_.DecrementtRNA(old_stop);
  }

  // Check for new covered and uncovered elements
  CheckBehind(old_start, pol->start());
  if (pol->name() == "__rnase") {
    CheckAheadRnase(old_stop, pol->stop());
  } else {
    CheckAhead(old_stop, pol->stop());
  }
  
  // Check if polymerase has run into a terminator
  bool terminating = CheckTermination(pol_index);
  if (terminating && pol->name() != "__rnase") {
    std::vector<Interval<BindingSite::Ptr>> results;
    binding_sites_.findOverlapping(old_start, pol->stop(), results);
    for (auto &interval : results) {
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        LogUncover(interval.value->name());
      }
      interval.value->ResetState();
    }
    return;
  }

  auto transcript = polymerases_.GetAttached(pol_index);
  if (transcript != nullptr) {
    transcript->ShiftMask();
  }

  // Update propensity for new codon (TODO: make its own function)
  if (pol->name() == "__ribosome") {
    polymerases_.UpdatePropensity(pol_index);
  }
}